

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_state_use_pasv(Curl_easy *data,connectdata *conn)

{
  ulong uVar1;
  CURLcode CVar2;
  
  uVar1 = *(ulong *)&(conn->bits).field_0x4;
  if (((uint)uVar1 & 0x82000) == 0x2000) {
    *(ulong *)&(conn->bits).field_0x4 = uVar1 | 0x80000;
  }
  uVar1 = *(ulong *)&(conn->bits).field_0x4;
  CVar2 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"%s",
                        ftp_state_use_pasv::mode + ((ulong)(((uint)uVar1 & 0x80000) >> 0x13) ^ 1));
  if (CVar2 == CURLE_OK) {
    *(uint *)((long)&conn->proto + 0xc4) = (uint)((uVar1 & 0x80000) == 0);
    (data->conn->proto).ftpc.state = FTP_PASV;
    Curl_infof(data,"Connect data stream passively");
  }
  return CVar2;
}

Assistant:

static CURLcode ftp_state_use_pasv(struct Curl_easy *data,
                                   struct connectdata *conn)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result = CURLE_OK;
  /*
    Here's the executive summary on what to do:

    PASV is RFC959, expect:
    227 Entering Passive Mode (a1,a2,a3,a4,p1,p2)

    LPSV is RFC1639, expect:
    228 Entering Long Passive Mode (4,4,a1,a2,a3,a4,2,p1,p2)

    EPSV is RFC2428, expect:
    229 Entering Extended Passive Mode (|||port|)

  */

  static const char mode[][5] = { "EPSV", "PASV" };
  int modeoff;

#ifdef PF_INET6
  if(!conn->bits.ftp_use_epsv && conn->bits.ipv6)
    /* EPSV is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPSV again! */
    conn->bits.ftp_use_epsv = TRUE;
#endif

  modeoff = conn->bits.ftp_use_epsv?0:1;

  result = Curl_pp_sendf(data, &ftpc->pp, "%s", mode[modeoff]);
  if(!result) {
    ftpc->count1 = modeoff;
    state(data, FTP_PASV);
    infof(data, "Connect data stream passively");
  }
  return result;
}